

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main3.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  ulong uVar2;
  int i;
  long lVar3;
  Graph g;
  vector<double,_std::allocator<double>_> distsGraph;
  int seedPixs [1];
  vector<int,_std::allocator<int>_> backPoints;
  vector<double,_std::allocator<double>_> maxVector;
  KMaxDistance kmax;
  
  g.nodes.
  super__Vector_base<std::vector<Edge,_std::allocator<Edge>_>,_std::allocator<std::vector<Edge,_std::allocator<Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  g.nodes.
  super__Vector_base<std::vector<Edge,_std::allocator<Edge>_>,_std::allocator<std::vector<Edge,_std::allocator<Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  g.nodes.
  super__Vector_base<std::vector<Edge,_std::allocator<Edge>_>,_std::allocator<std::vector<Edge,_std::allocator<Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  g.size = 0;
  Graph::addNode(&g);
  Graph::addNode(&g);
  Graph::addNode(&g);
  Graph::addNode(&g);
  Graph::addNode(&g);
  Graph::addNode(&g);
  Graph::addEdge(&g,0,1,0.4);
  Graph::addEdge(&g,1,2,0.3);
  Graph::addEdge(&g,2,4,0.2);
  Graph::addEdge(&g,0,3,0.5);
  Graph::addEdge(&g,3,4,0.1);
  Graph::addEdge(&g,4,5,0.3);
  Graph::printInfo(&g);
  kmax.probabThresh = -0.1;
  seedPixs[0] = 0;
  backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  maxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  maxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  maxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  KMaxDistance::compute(&kmax,&g,2,seedPixs,1,-5,&distsGraph,&backPoints,&maxVector);
  printf("Distance: %.3f\n");
  lVar3 = 0;
  printf("Max vector: ( ");
  do {
    printf("%.3f ",maxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  puts(")");
  puts("Distances to nodes:");
  if (distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar2 = 0;
    do {
      printf("Distance to node %d: %.3f\n",
             distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2],uVar2);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < (ulong)((long)distsGraph.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)distsGraph.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  puts("Backtracking:");
  if (*backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != -1) {
    lVar3 = 4;
    do {
      printf("%d ");
      piVar1 = (int *)((long)backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3);
      lVar3 = lVar3 + 4;
    } while (*piVar1 != -1);
  }
  putchar(10);
  if (distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(distsGraph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (maxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(maxVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(backPoints.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Edge,_std::allocator<Edge>_>,_std::allocator<std::vector<Edge,_std::allocator<Edge>_>_>_>
  ::~vector(&g.nodes);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
    Graph g;
	g.addNode();
	g.addNode();
	g.addNode();
	g.addNode();
	g.addNode();
	g.addNode();
	g.addEdge(0, 1, 0.4);
	g.addEdge(1, 2, 0.3);
	g.addEdge(2, 4, 0.2);
	g.addEdge(0, 3, 0.5);
	g.addEdge(3, 4, 0.1);
	g.addEdge(4, 5, 0.3);
	g.printInfo();
	 
    KMaxDistance kmax;
    
    const int numSeedPixs = 1;
    int seedPixs[numSeedPixs];
    seedPixs[0] = 0;
    int dstPix = 5;
    
    std::vector<int> backPoints;
    std::vector<double> maxVector;
    std::vector<double> distsGraph;
    int k = 2;
    
    double dist = kmax.compute(g, k, seedPixs, numSeedPixs, -dstPix, &distsGraph, &backPoints, &maxVector);
    printf("Distance: %.3f\n", dist);
    
    printf("Max vector: ( "); 
    for(int i = 0; i < k; i++) printf("%.3f ", maxVector[i]);
    printf(")\n");
    
    printf("Distances to nodes:\n");
	for (unsigned int i = 0; i < distsGraph.size(); i++)
	{
		printf("Distance to node %d: %.3f\n", i, distsGraph[i]);
	}
   
    printf("Backtracking:\n");
    int i = 0;
    while(backPoints[i] != -1)
    {
		printf("%d ", backPoints[i++]);
	}
	printf("\n");
    
    return 0;
}